

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O1

void __thiscall
jrtplib::RTPFakeTransmitter::DeleteTransmissionInfo
          (RTPFakeTransmitter *this,RTPTransmissionInfo *inf)

{
  RTPMemoryManager *pRVar1;
  
  if (this->init == true) {
    pRVar1 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
    if (pRVar1 != (RTPMemoryManager *)0x0) {
      (**inf->_vptr_RTPTransmissionInfo)(inf);
      (**(code **)(*(long *)pRVar1 + 0x18))(pRVar1,inf);
      return;
    }
    if (inf != (RTPTransmissionInfo *)0x0) {
      (*inf->_vptr_RTPTransmissionInfo[1])(inf);
      return;
    }
  }
  return;
}

Assistant:

void RTPFakeTransmitter::DeleteTransmissionInfo(RTPTransmissionInfo *inf)
{
	if (!init)
		return;
	RTPDelete(inf,GetMemoryManager());
}